

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::IsPolylineVertexInside
          (CrossingProcessor *this,bool matches_polyline,bool matches_polygon)

{
  bool bVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  byte bVar3;
  
  bVar1 = this->invert_b_;
  bVar2 = this->inside_;
  bVar3 = bVar2 != bVar1;
  if ((int)CONCAT71(in_register_00000031,matches_polyline) == 0) {
    if (!matches_polygon) goto LAB_0019e3aa;
  }
  else if ((this->is_union_ & matches_polygon) == 0) {
    bVar3 = bVar2 != bVar1 | this->is_union_ ^ 1U;
    goto LAB_0019e3aa;
  }
  bVar3 = this->polygon_model_ == CLOSED;
  if (this->polygon_model_ == SEMI_OPEN) {
    bVar3 = bVar2 != bVar1;
  }
LAB_0019e3aa:
  return bVar1 != (bool)bVar3;
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::IsPolylineVertexInside(
    bool matches_polyline, bool matches_polygon) const {
  // "contained" indicates whether the current point is inside the polygonal
  // interior of the opposite region using semi-open boundaries.
  bool contained = inside_ ^ invert_b_;

  // For UNION the output includes duplicate polylines.  The test below
  // ensures that isolated polyline vertices are not suppressed by other
  // polyline vertices in the output.
  if (matches_polyline && !is_union_) {
    contained = true;
  } else if (matches_polygon && polygon_model_ != PolygonModel::SEMI_OPEN) {
    contained = (polygon_model_ == PolygonModel::CLOSED);
  }
  // Finally, invert the result if the opposite region should be inverted.
  return contained ^ invert_b_;
}